

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall
fasttext::DenseMatrix::uniformThread(DenseMatrix *this,real a,int block,int32_t seed)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  result_type_conflict rVar7;
  undefined1 in_register_00001204 [60];
  undefined1 auVar8 [64];
  minstd_rand rng;
  param_type local_38;
  
  auVar8._4_60_ = in_register_00001204;
  auVar8._0_4_ = a;
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(auVar8._0_16_,auVar6);
  uVar3 = (ulong)(long)(seed + block) % 0x7fffffff;
  rng._M_x = uVar3 + (uVar3 == 0);
  auVar6 = vinsertps_avx(auVar6,auVar8._0_16_,0x1c);
  local_38 = (param_type)vcvtps2pd_avx(auVar6);
  lVar2 = (this->super_Matrix).m_;
  lVar4 = (this->super_Matrix).n_;
  lVar1 = (lVar4 * lVar2) / 10;
  for (lVar5 = lVar1 * block; (lVar5 < lVar4 * lVar2 && (lVar5 < (block + 1) * lVar1));
      lVar5 = lVar5 + 1) {
    rVar7 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)&local_38,&rng);
    (this->data_).mem_[lVar5] = (float)rVar7;
    lVar2 = (this->super_Matrix).m_;
    lVar4 = (this->super_Matrix).n_;
  }
  return;
}

Assistant:

void DenseMatrix::uniformThread(real a, int block, int32_t seed) {
  std::minstd_rand rng(block + seed);
  std::uniform_real_distribution<> uniform(-a, a);
  int64_t blockSize = (m_ * n_) / 10;
  for (int64_t i = blockSize * block;
       i < (m_ * n_) && i < blockSize * (block + 1);
       i++) {
    data_[i] = uniform(rng);
  }
}